

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_create_with_capacity(uint32_t cap)

{
  _Bool _Var1;
  _Bool is_ok;
  roaring_bitmap_t *ans;
  roaring_array_t *prStack_10;
  uint32_t cap_local;
  
  prStack_10 = (roaring_array_t *)malloc(0x28);
  if (prStack_10 == (roaring_array_t *)0x0) {
    prStack_10 = (roaring_array_t *)0x0;
  }
  else {
    _Var1 = ra_init_with_capacity(prStack_10,cap);
    if (!_Var1) {
      free(prStack_10);
      prStack_10 = (roaring_array_t *)0x0;
    }
  }
  return (roaring_bitmap_t *)prStack_10;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_create_with_capacity(uint32_t cap) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    bool is_ok = ra_init_with_capacity(&ans->high_low_container, cap);
    if (!is_ok) {
        free(ans);
        return NULL;
    }
    return ans;
}